

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _listIterator.hpp
# Opt level: O3

void __thiscall
ft::map<int,int,ft::less<int>,ft::allocator<ft::pair<int_const,int>>>::
insert<ft::listIterator<ft::pair<int,int>>>
          (map<int,int,ft::less<int>,ft::allocator<ft::pair<int_const,int>>> *this,
          listIterator<ft::pair<int,_int>_> *first,listIterator<ft::pair<int,_int>_> *last,
          type *param_3)

{
  Node *pNVar1;
  pair<ft::treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>,_bool>
  local_58;
  value_type local_38;
  
  pNVar1 = first->m_node;
  if (pNVar1 != last->m_node) {
    do {
      local_38.first = (pNVar1->data).first;
      local_38.second = (pNVar1->data).second;
      map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>::insert
                (&local_58,
                 (map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *)this,
                 &local_38);
      pNVar1 = first->m_node->next;
      first->m_node = pNVar1;
    } while (pNVar1 != last->m_node);
  }
  return;
}

Assistant:

Node*	node() const { return this->m_node; }